

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O0

string * __thiscall
deqp::gles2::Performance::lightVertexTemplate_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,int numLights,bool isVertexCase,
          LightType lightType)

{
  undefined3 in_register_00000009;
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  undefined1 local_2b8 [8];
  string ndxStr_1;
  undefined1 local_290 [4];
  int lightNdx_1;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string ndxStr;
  int lightNdx;
  LightType lightType_local;
  bool isVertexCase_local;
  string *psStack_10;
  int numLights_local;
  string *resultTemplate;
  
  iVar1 = CONCAT31(in_register_00000009,isVertexCase);
  lightType_local = (LightType)this;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,
             "attribute highp vec4 a_position${NAME_SPEC};\nattribute mediump vec3 a_normal${NAME_SPEC};\nattribute mediump vec4 a_texCoord0${NAME_SPEC};\nuniform mediump vec3 u_material_ambientColor${NAME_SPEC};\nuniform mediump vec4 u_material_diffuseColor${NAME_SPEC};\nuniform mediump vec3 u_material_emissiveColor${NAME_SPEC};\nuniform mediump vec3 u_material_specularColor${NAME_SPEC};\nuniform mediump float u_material_shininess${NAME_SPEC};\n"
            );
  for (ndxStr.field_2._8_4_ = 0; (int)ndxStr.field_2._8_4_ < (int)lightType_local;
      ndxStr.field_2._8_4_ = ndxStr.field_2._8_4_ + 1) {
    de::toString<int>((string *)local_50,(int *)(ndxStr.field_2._M_local_buf + 8));
    std::operator+(&local_d0,"uniform mediump vec3 u_light",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    std::operator+(&local_b0,&local_d0,"_color${NAME_SPEC};\nuniform mediump vec3 u_light");
    std::operator+(&local_90,&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    std::operator+(&local_70,&local_90,"_direction${NAME_SPEC};\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    if (iVar1 == 1) {
      std::operator+(&local_1d0,"uniform mediump vec4 u_light",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      std::operator+(&local_1b0,&local_1d0,"_position${NAME_SPEC};\nuniform mediump float u_light");
      std::operator+(&local_190,&local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      std::operator+(&local_170,&local_190,
                     "_constantAttenuation${NAME_SPEC};\nuniform mediump float u_light");
      std::operator+(&local_150,&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      std::operator+(&local_130,&local_150,
                     "_linearAttenuation${NAME_SPEC};\nuniform mediump float u_light");
      std::operator+(&local_110,&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      std::operator+(&local_f0,&local_110,"_quadraticAttenuation${NAME_SPEC};\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,
             "uniform highp mat4 u_mvpMatrix${NAME_SPEC};\nuniform highp mat4 u_modelViewMatrix${NAME_SPEC};\nuniform mediump mat3 u_normalMatrix${NAME_SPEC};\nuniform mediump mat4 u_texCoordMatrix0${NAME_SPEC};\nvarying mediump vec4 v_color${NAME_SPEC};\nvarying mediump vec2 v_texCoord0${NAME_SPEC};\n"
            );
  if (((numLights & 1U) == 0) &&
     (std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,"varying mediump vec3 v_eyeNormal${NAME_SPEC};\n")
     , iVar1 == 1)) {
    de::toString<int>(&local_270,(int *)&lightType_local);
    std::operator+(&local_250,"varying mediump vec3 v_directionToLight${NAME_SPEC}[",&local_270);
    std::operator+(&local_230,&local_250,"];\nvarying mediump float v_distanceToLight${NAME_SPEC}[")
    ;
    de::toString<int>((string *)local_290,(int *)&lightType_local);
    std::operator+(&local_210,&local_230,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290);
    std::operator+(&local_1f0,&local_210,"];\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)local_290);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_270);
  }
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,
             "mediump vec3 direction (mediump vec4 from, mediump vec4 to)\n{\n\treturn vec3(to.xyz * from.w - from.xyz * to.w);\n}\n\nmediump vec3 computeLighting (\n\tmediump vec3 directionToLight,\n\tmediump vec3 halfVector,\n\tmediump vec3 normal,\n\tmediump vec3 lightColor,\n\tmediump vec3 diffuseColor,\n\tmediump vec3 specularColor,\n\tmediump float shininess)\n{\n\tmediump float normalDotDirection  = max(dot(normal, directionToLight), 0.0);\n\tmediump vec3  color               = normalDotDirection * diffuseColor * lightColor;\n\n\tif (normalDotDirection != 0.0)\n\t\tcolor += pow(max(dot(normal, halfVector), 0.0), shininess) * specularColor * lightColor;\n\n\treturn color;\n}\n\n"
            );
  if (iVar1 == 1) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "mediump float computeDistanceAttenuation (mediump float distToLight, mediump float constAtt, mediump float linearAtt, mediump float quadraticAtt)\n{\n\treturn 1.0 / (constAtt + linearAtt * distToLight + quadraticAtt * distToLight * distToLight);\n}\n\n"
              );
  }
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,
             "void main (void)\n{\n\thighp vec4 position = a_position${NAME_SPEC};\n\thighp vec3 normal = a_normal${NAME_SPEC};\n\tgl_Position = u_mvpMatrix${NAME_SPEC} * position * (0.95 + 0.05*${FLOAT01});\n\tv_texCoord0${NAME_SPEC} = (u_texCoordMatrix0${NAME_SPEC} * a_texCoord0${NAME_SPEC}).xy;\n\tmediump vec4 color = vec4(u_material_emissiveColor${NAME_SPEC}, u_material_diffuseColor${NAME_SPEC}.a);\n\n\thighp vec4 eyePosition = u_modelViewMatrix${NAME_SPEC} * position;\n\tmediump vec3 eyeNormal = normalize(u_normalMatrix${NAME_SPEC} * normal);\n"
            );
  if ((numLights & 1U) == 0) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"\tv_eyeNormal${NAME_SPEC} = eyeNormal;\n");
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  for (ndxStr_1.field_2._12_4_ = 0; (int)ndxStr_1.field_2._12_4_ < (int)lightType_local;
      ndxStr_1.field_2._12_4_ = ndxStr_1.field_2._12_4_ + 1) {
    de::toString<int>((string *)local_2b8,(int *)(ndxStr_1.field_2._M_local_buf + 0xc));
    std::operator+(&local_2f8,"\t/* Light ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
    std::operator+(&local_2d8,&local_2f8," */\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2f8);
    if (iVar1 == 1) {
      std::operator+(&local_3f8,"\tmediump float distanceToLight",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8)
      ;
      std::operator+(&local_3d8,&local_3f8," = distance(eyePosition, u_light");
      std::operator+(&local_3b8,&local_3d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8)
      ;
      std::operator+(&local_398,&local_3b8,
                     "_position${NAME_SPEC});\n\tmediump vec3 directionToLight");
      std::operator+(&local_378,&local_398,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8)
      ;
      std::operator+(&local_358,&local_378," = normalize(direction(eyePosition, u_light");
      std::operator+(&local_338,&local_358,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8)
      ;
      std::operator+(&local_318,&local_338,"_position${NAME_SPEC}));\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_318);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_3f8);
      if ((numLights & 1U) == 0) {
        std::operator+(&local_738,"\tv_directionToLight${NAME_SPEC}[",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b8);
        std::operator+(&local_718,&local_738,"] = directionToLight");
        std::operator+(&local_6f8,&local_718,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b8);
        std::operator+(&local_6d8,&local_6f8,";\n\tv_distanceToLight${NAME_SPEC}[");
        std::operator+(&local_6b8,&local_6d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b8);
        std::operator+(&local_698,&local_6b8,"]  = distanceToLight");
        std::operator+(&local_678,&local_698,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b8);
        std::operator+(&local_658,&local_678,";\n");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_658);
        std::__cxx11::string::~string((string *)&local_658);
        std::__cxx11::string::~string((string *)&local_678);
        std::__cxx11::string::~string((string *)&local_698);
        std::__cxx11::string::~string((string *)&local_6b8);
        std::__cxx11::string::~string((string *)&local_6d8);
        std::__cxx11::string::~string((string *)&local_6f8);
        std::__cxx11::string::~string((string *)&local_718);
        std::__cxx11::string::~string((string *)&local_738);
      }
      else {
        std::operator+(&local_638,"\tmediump vec3 halfVector",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b8);
        std::operator+(&local_618,&local_638," = normalize(directionToLight");
        std::operator+(&local_5f8,&local_618,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b8);
        std::operator+(&local_5d8,&local_5f8,
                       " + vec3(0.0, 0.0, 1.0));\n\tcolor.rgb += computeLighting(directionToLight");
        std::operator+(&local_5b8,&local_5d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b8);
        std::operator+(&local_598,&local_5b8,", halfVector");
        std::operator+(&local_578,&local_598,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b8);
        std::operator+(&local_558,&local_578,", eyeNormal, u_light");
        std::operator+(&local_538,&local_558,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b8);
        std::operator+(&local_518,&local_538,
                       "_color${NAME_SPEC}, u_material_diffuseColor${NAME_SPEC}.rgb, u_material_specularColor${NAME_SPEC}, u_material_shininess${NAME_SPEC}) * computeDistanceAttenuation(distanceToLight"
                      );
        std::operator+(&local_4f8,&local_518,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b8);
        std::operator+(&local_4d8,&local_4f8,", u_light");
        std::operator+(&local_4b8,&local_4d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b8);
        std::operator+(&local_498,&local_4b8,"_constantAttenuation${NAME_SPEC}, u_light");
        std::operator+(&local_478,&local_498,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b8);
        std::operator+(&local_458,&local_478,"_linearAttenuation${NAME_SPEC}, u_light");
        std::operator+(&local_438,&local_458,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b8);
        std::operator+(&local_418,&local_438,"_quadraticAttenuation${NAME_SPEC});\n");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_418);
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::string::~string((string *)&local_438);
        std::__cxx11::string::~string((string *)&local_458);
        std::__cxx11::string::~string((string *)&local_478);
        std::__cxx11::string::~string((string *)&local_498);
        std::__cxx11::string::~string((string *)&local_4b8);
        std::__cxx11::string::~string((string *)&local_4d8);
        std::__cxx11::string::~string((string *)&local_4f8);
        std::__cxx11::string::~string((string *)&local_518);
        std::__cxx11::string::~string((string *)&local_538);
        std::__cxx11::string::~string((string *)&local_558);
        std::__cxx11::string::~string((string *)&local_578);
        std::__cxx11::string::~string((string *)&local_598);
        std::__cxx11::string::~string((string *)&local_5b8);
        std::__cxx11::string::~string((string *)&local_5d8);
        std::__cxx11::string::~string((string *)&local_5f8);
        std::__cxx11::string::~string((string *)&local_618);
        std::__cxx11::string::~string((string *)&local_638);
      }
    }
    else if ((iVar1 == 0) && ((numLights & 1U) != 0)) {
      std::operator+(&local_8f8,"\tmediump vec3 directionToLight",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8)
      ;
      std::operator+(&local_8d8,&local_8f8," = -u_light");
      std::operator+(&local_8b8,&local_8d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8)
      ;
      std::operator+(&local_898,&local_8b8,"_direction${NAME_SPEC};\n\tmediump vec3 halfVector");
      std::operator+(&local_878,&local_898,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8)
      ;
      std::operator+(&local_858,&local_878," = normalize(directionToLight");
      std::operator+(&local_838,&local_858,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8)
      ;
      std::operator+(&local_818,&local_838,
                     " + vec3(0.0, 0.0, 1.0));\n\tcolor.rgb += computeLighting(directionToLight");
      std::operator+(&local_7f8,&local_818,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8)
      ;
      std::operator+(&local_7d8,&local_7f8,", halfVector");
      std::operator+(&local_7b8,&local_7d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8)
      ;
      std::operator+(&local_798,&local_7b8,", eyeNormal, u_light");
      std::operator+(&local_778,&local_798,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8)
      ;
      std::operator+(&local_758,&local_778,
                     "_color${NAME_SPEC}, u_material_diffuseColor${NAME_SPEC}.rgb, u_material_specularColor${NAME_SPEC}, u_material_shininess${NAME_SPEC});\n"
                    );
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_758);
      std::__cxx11::string::~string((string *)&local_758);
      std::__cxx11::string::~string((string *)&local_778);
      std::__cxx11::string::~string((string *)&local_798);
      std::__cxx11::string::~string((string *)&local_7b8);
      std::__cxx11::string::~string((string *)&local_7d8);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_818);
      std::__cxx11::string::~string((string *)&local_838);
      std::__cxx11::string::~string((string *)&local_858);
      std::__cxx11::string::~string((string *)&local_878);
      std::__cxx11::string::~string((string *)&local_898);
      std::__cxx11::string::~string((string *)&local_8b8);
      std::__cxx11::string::~string((string *)&local_8d8);
      std::__cxx11::string::~string((string *)&local_8f8);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
    std::__cxx11::string::~string((string *)local_2b8);
  }
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,
             "\tv_color${NAME_SPEC} = color;\n${SEMANTIC_ERROR}}\n${INVALID_CHAR}");
  return __return_storage_ptr__;
}

Assistant:

static string lightVertexTemplate (int numLights, bool isVertexCase, LightType lightType)
{
	string resultTemplate;

	resultTemplate +=
		"attribute highp vec4 a_position${NAME_SPEC};\n"
		"attribute mediump vec3 a_normal${NAME_SPEC};\n"
		"attribute mediump vec4 a_texCoord0${NAME_SPEC};\n"
		"uniform mediump vec3 u_material_ambientColor${NAME_SPEC};\n"
		"uniform mediump vec4 u_material_diffuseColor${NAME_SPEC};\n"
		"uniform mediump vec3 u_material_emissiveColor${NAME_SPEC};\n"
		"uniform mediump vec3 u_material_specularColor${NAME_SPEC};\n"
		"uniform mediump float u_material_shininess${NAME_SPEC};\n";

	for (int lightNdx = 0; lightNdx < numLights; lightNdx++)
	{
		string ndxStr = de::toString(lightNdx);

		resultTemplate +=
			"uniform mediump vec3 u_light" + ndxStr + "_color${NAME_SPEC};\n"
			"uniform mediump vec3 u_light" + ndxStr + "_direction${NAME_SPEC};\n";

		if (lightType == LIGHT_POINT)
			resultTemplate +=
				"uniform mediump vec4 u_light" + ndxStr + "_position${NAME_SPEC};\n"
				"uniform mediump float u_light" + ndxStr + "_constantAttenuation${NAME_SPEC};\n"
				"uniform mediump float u_light" + ndxStr + "_linearAttenuation${NAME_SPEC};\n"
				"uniform mediump float u_light" + ndxStr + "_quadraticAttenuation${NAME_SPEC};\n";
	}

	resultTemplate +=
		"uniform highp mat4 u_mvpMatrix${NAME_SPEC};\n"
		"uniform highp mat4 u_modelViewMatrix${NAME_SPEC};\n"
		"uniform mediump mat3 u_normalMatrix${NAME_SPEC};\n"
		"uniform mediump mat4 u_texCoordMatrix0${NAME_SPEC};\n"
		"varying mediump vec4 v_color${NAME_SPEC};\n"
		"varying mediump vec2 v_texCoord0${NAME_SPEC};\n";

	if (!isVertexCase)
	{
		resultTemplate += "varying mediump vec3 v_eyeNormal${NAME_SPEC};\n";

		if (lightType == LIGHT_POINT)
			resultTemplate +=
				"varying mediump vec3 v_directionToLight${NAME_SPEC}[" + de::toString(numLights) + "];\n"
				"varying mediump float v_distanceToLight${NAME_SPEC}[" + de::toString(numLights) + "];\n";
	}

	resultTemplate +=
		"mediump vec3 direction (mediump vec4 from, mediump vec4 to)\n"
		"{\n"
		"	return vec3(to.xyz * from.w - from.xyz * to.w);\n"
		"}\n"
		"\n"
		"mediump vec3 computeLighting (\n"
		"	mediump vec3 directionToLight,\n"
		"	mediump vec3 halfVector,\n"
		"	mediump vec3 normal,\n"
		"	mediump vec3 lightColor,\n"
		"	mediump vec3 diffuseColor,\n"
		"	mediump vec3 specularColor,\n"
		"	mediump float shininess)\n"
		"{\n"
		"	mediump float normalDotDirection  = max(dot(normal, directionToLight), 0.0);\n"
		"	mediump vec3  color               = normalDotDirection * diffuseColor * lightColor;\n"
		"\n"
		"	if (normalDotDirection != 0.0)\n"
		"		color += pow(max(dot(normal, halfVector), 0.0), shininess) * specularColor * lightColor;\n"
		"\n"
		"	return color;\n"
		"}\n"
		"\n";

	if (lightType == LIGHT_POINT)
		resultTemplate +=
			"mediump float computeDistanceAttenuation (mediump float distToLight, mediump float constAtt, mediump float linearAtt, mediump float quadraticAtt)\n"
			"{\n"
			"	return 1.0 / (constAtt + linearAtt * distToLight + quadraticAtt * distToLight * distToLight);\n"
			"}\n"
			"\n";

	resultTemplate +=
		"void main (void)\n"
		"{\n"
		"	highp vec4 position = a_position${NAME_SPEC};\n"
		"	highp vec3 normal = a_normal${NAME_SPEC};\n"
		"	gl_Position = u_mvpMatrix${NAME_SPEC} * position * (0.95 + 0.05*${FLOAT01});\n"
		"	v_texCoord0${NAME_SPEC} = (u_texCoordMatrix0${NAME_SPEC} * a_texCoord0${NAME_SPEC}).xy;\n"
		"	mediump vec4 color = vec4(u_material_emissiveColor${NAME_SPEC}, u_material_diffuseColor${NAME_SPEC}.a);\n"
		"\n"
		"	highp vec4 eyePosition = u_modelViewMatrix${NAME_SPEC} * position;\n"
		"	mediump vec3 eyeNormal = normalize(u_normalMatrix${NAME_SPEC} * normal);\n";

	if (!isVertexCase)
		resultTemplate += "\tv_eyeNormal${NAME_SPEC} = eyeNormal;\n";

	resultTemplate += "\n";

	for (int lightNdx = 0; lightNdx < numLights; lightNdx++)
	{
		string ndxStr = de::toString(lightNdx);

		resultTemplate +=
			"	/* Light " + ndxStr + " */\n";

		if (lightType == LIGHT_POINT)
		{
			resultTemplate +=
				"	mediump float distanceToLight" + ndxStr + " = distance(eyePosition, u_light" + ndxStr + "_position${NAME_SPEC});\n"
				"	mediump vec3 directionToLight" + ndxStr + " = normalize(direction(eyePosition, u_light" + ndxStr + "_position${NAME_SPEC}));\n";

			if (isVertexCase)
				resultTemplate +=
					"	mediump vec3 halfVector" + ndxStr + " = normalize(directionToLight" + ndxStr + " + vec3(0.0, 0.0, 1.0));\n"
					"	color.rgb += computeLighting(directionToLight" + ndxStr + ", halfVector" + ndxStr + ", eyeNormal, u_light" + ndxStr + "_color${NAME_SPEC}, u_material_diffuseColor${NAME_SPEC}.rgb, "
					"u_material_specularColor${NAME_SPEC}, u_material_shininess${NAME_SPEC}) * computeDistanceAttenuation(distanceToLight" + ndxStr + ", u_light" + ndxStr + "_constantAttenuation${NAME_SPEC}, "
					"u_light" + ndxStr + "_linearAttenuation${NAME_SPEC}, u_light" + ndxStr + "_quadraticAttenuation${NAME_SPEC});\n";
			else
				resultTemplate +=
					"	v_directionToLight${NAME_SPEC}[" + ndxStr + "] = directionToLight" + ndxStr + ";\n"
					"	v_distanceToLight${NAME_SPEC}[" + ndxStr + "]  = distanceToLight" + ndxStr + ";\n";
		}
		else if (lightType == LIGHT_DIRECTIONAL)
		{
			if (isVertexCase)
				resultTemplate +=
					"	mediump vec3 directionToLight" + ndxStr + " = -u_light" + ndxStr + "_direction${NAME_SPEC};\n"
					"	mediump vec3 halfVector" + ndxStr + " = normalize(directionToLight" + ndxStr + " + vec3(0.0, 0.0, 1.0));\n"
					"	color.rgb += computeLighting(directionToLight" + ndxStr + ", halfVector" + ndxStr + ", eyeNormal, u_light" + ndxStr + "_color${NAME_SPEC}, u_material_diffuseColor${NAME_SPEC}.rgb, u_material_specularColor${NAME_SPEC}, u_material_shininess${NAME_SPEC});\n";
		}
		else
			DE_ASSERT(DE_FALSE);

		resultTemplate += "\n";
	}

	resultTemplate +=
		"	v_color${NAME_SPEC} = color;\n"
		"${SEMANTIC_ERROR}"
		"}\n"
		"${INVALID_CHAR}";

	return resultTemplate;
}